

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall helics::TimeDependencies::isDependency(TimeDependencies *this,GlobalFederateId ofed)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  pointer pDVar4;
  BaseType in_ESI;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  res;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffa8
  ;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar5;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [2];
  GlobalFederateId local_8;
  bool local_1;
  
  local_8.gid = in_ESI;
  cVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                    (in_stack_ffffffffffffffa8);
  cVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                    (in_stack_ffffffffffffffa8);
  local_18[0] = std::
                lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                          (cVar2._M_current,cVar3._M_current,&local_8);
  std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
            (in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::
          operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                    ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pDVar4 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator->(local_18);
    bVar1 = GlobalFederateId::operator==(&pDVar4->fedID,local_8);
    if (bVar1) {
      pDVar4 = __gnu_cxx::
               __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      bVar5 = pDVar4->dependency;
    }
    else {
      bVar5 = 0;
    }
    local_1 = (bool)(bVar5 & 1);
  }
  return local_1;
}

Assistant:

bool TimeDependencies::isDependency(GlobalFederateId ofed) const
{
    auto res = std::lower_bound(dependencies.begin(), dependencies.end(), ofed, dependencyCompare);
    if (res == dependencies.end()) {
        return false;
    }
    return (res->fedID == ofed) ? res->dependency : false;
}